

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O2

void __thiscall ICOReader::readColorTable(ICOReader *this,QImage *image)

{
  long lVar1;
  int i;
  uint uVar2;
  long in_FS_OFFSET;
  QImage local_50 [28];
  undefined4 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->iod == (QIODevice *)0x0) {
LAB_001042e4:
    QImage::QImage(local_50);
    QImage::operator=(image,local_50);
    QImage::~QImage(local_50);
  }
  else {
    QImage::setColorCount((int)image);
    local_34 = 0xaaaaaaaa;
    for (uVar2 = 0; (int)uVar2 < (this->icoAttrib).ncolors; uVar2 = uVar2 + 1) {
      lVar1 = QIODevice::read((char *)this->iod,(longlong)&local_34);
      if (lVar1 != 4) goto LAB_001042e4;
      QImage::setColor((int)image,uVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ICOReader::readColorTable(QImage & image)
{
    if (iod) {
        image.setColorCount(icoAttrib.ncolors);
        uchar rgb[4];
        for (int i=0; i<icoAttrib.ncolors; i++) {
            if (iod->read((char*)rgb, 4) != 4) {
            image = QImage();
            break;
            }
            image.setColor(i, qRgb(rgb[2],rgb[1],rgb[0]));
        }
    } else {
        image = QImage();
    }
}